

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# log.cpp
# Opt level: O2

my_time get_current_sys_time(void)

{
  tm *ptVar1;
  undefined8 extraout_RDX;
  my_time mVar2;
  time_t tt;
  long local_8;
  
  local_8 = std::chrono::_V2::system_clock::now();
  local_8 = local_8 / 1000000000;
  ptVar1 = localtime(&local_8);
  mVar2._0_8_ = (ulong)(ptVar1->tm_year + 0x76c) |
                (ulong)(ptVar1->tm_mon + 1U & 0xff) << 0x20 |
                (ulong)(byte)ptVar1->tm_mday << 0x28 |
                (ulong)(byte)ptVar1->tm_hour << 0x30 | (ulong)(uint)ptVar1->tm_min << 0x38;
  mVar2._8_4_ = (undefined4)CONCAT71((int7)((ulong)extraout_RDX >> 8),(char)ptVar1->tm_sec);
  return mVar2;
}

Assistant:

static my_time get_current_sys_time()
{
    auto tt = chrono::system_clock::to_time_t(chrono::system_clock::now());
    struct tm* ptm = localtime(&tt);
    my_time t = { ptm->tm_year + 1900, static_cast<char>(ptm->tm_mon + 1), static_cast<char>(ptm->tm_mday),
            static_cast<char>(ptm->tm_hour), static_cast<char>(ptm->tm_min), static_cast<char>(ptm->tm_sec)};
    return t;
}